

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O2

void __thiscall TrodesMsg::processArg(TrodesMsg *this,char c,binarydata *a)

{
  string *this_00;
  allocator local_11;
  
  if (c == 'n') {
    CZHelp::zmsg_popNDT(this->msg,a);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            (this_00,"Could not read message. Expected different type, got NDT",&local_11);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void TrodesMsg::processArg(const char c, binarydata &a){
    if(c != 'n') throw std::string(PROCESSERROR "NDT");
    CZHelp::zmsg_popNDT(msg, a);
}